

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

int INT_EVfreeze_stone(CManager_conflict cm,EVstone stone_id)

{
  int iVar1;
  stone_type p_Var2;
  
  p_Var2 = stone_struct(cm->evp,stone_id);
  if (p_Var2 == (stone_type)0x0) {
    iVar1 = -1;
  }
  else {
    p_Var2->is_frozen = 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

extern int
INT_EVfreeze_stone(CManager cm, EVstone stone_id)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    stone = stone_struct(evp, stone_id);
    if (!stone) return -1;
    stone->is_frozen = 1;
    return 1;	
}